

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine.c
# Opt level: O0

void glmc_scale_make(vec4 *m,float *v)

{
  undefined4 *in_RSI;
  undefined8 *in_RDI;
  mat4 t;
  undefined1 local_f8 [4];
  undefined4 uStack_f4;
  undefined8 uStack_f0;
  undefined4 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined4 uStack_cc;
  undefined8 local_c8;
  undefined4 uStack_c0;
  undefined8 *local_b0;
  
  local_b0 = in_RDI;
  memset(local_f8,0,0x40);
  *local_b0 = CONCAT44(uStack_f4,0x3f800000);
  local_b0[1] = uStack_f0;
  local_b0[2] = CONCAT44(0x3f800000,local_e8);
  local_b0[3] = uStack_e0;
  local_b0[4] = local_d8;
  local_b0[5] = CONCAT44(uStack_cc,0x3f800000);
  local_b0[6] = local_c8;
  local_b0[7] = CONCAT44(0x3f800000,uStack_c0);
  *(undefined4 *)in_RDI = *in_RSI;
  *(undefined4 *)((long)in_RDI + 0x14) = in_RSI[1];
  *(undefined4 *)(in_RDI + 5) = in_RSI[2];
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_scale_make(mat4 m, vec3 v) {
  glm_scale_make(m, v);
}